

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenu::wheelEvent(QMenu *this,QWheelEvent *e)

{
  QMenuPrivate *this_00;
  char cVar1;
  long in_FS_OFFSET;
  QPointF local_48;
  QPoint local_38;
  QRect local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  if (this_00->scroll != (QMenuScroller *)0x0) {
    local_30 = QWidget::rect(&this->super_QWidget);
    local_48 = QSinglePointEvent::position((QSinglePointEvent *)e);
    local_38 = QPointF::toPoint(&local_48);
    cVar1 = QRect::contains((QPoint *)&local_30,SUB81(&local_38,0));
    if (cVar1 != '\0') {
      QMenuPrivate::scrollMenu(this_00,(*(int *)(e + 0x5c) < 1) + ScrollUp,false,false);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::wheelEvent(QWheelEvent *e)
{
    Q_D(QMenu);
    if (d->scroll && rect().contains(e->position().toPoint()))
        d->scrollMenu(e->angleDelta().y() > 0 ?
                      QMenuPrivate::QMenuScroller::ScrollUp : QMenuPrivate::QMenuScroller::ScrollDown);
}